

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_lzhuf.cxx
# Opt level: O0

void __thiscall xray_re::_lzhuf::EncodeChar(_lzhuf *this,uint c)

{
  uint local_20;
  int local_1c;
  int k;
  int j;
  uint i;
  uint c_local;
  _lzhuf *this_local;
  
  k = 0;
  local_1c = 0;
  local_20 = this->prnt[c + 0x273];
  do {
    k = (uint)k >> 1;
    if ((local_20 & 1) != 0) {
      k = k + 0x8000;
    }
    local_1c = local_1c + 1;
    local_20 = this->prnt[(int)local_20];
  } while (local_20 != 0x272);
  Putcode(this,local_1c,k);
  update(this,c);
  return;
}

Assistant:

void _lzhuf::EncodeChar(unsigned c)
{
	unsigned i;
	int j, k;

	i = 0;
	j = 0;
	k = prnt[c + T];

	/* travel from leaf to root */
	do {
		i >>= 1;

		/* if node's address is odd-numbered, choose bigger brother node */
		if (k & 1) i += 0x8000;

		j++;
	} while ((k = prnt[k]) != R);
	Putcode(j, i);
//	code = i;
//	len = j;
	update(c);
}